

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O1

void ParseDecorate(FScanner *sc)

{
  byte *pbVar1;
  byte bVar2;
  PInt *pPVar3;
  PBool *pPVar4;
  PFloat *pPVar5;
  PStatePointer *pPVar6;
  FString statename;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  PClassActor *pPVar12;
  PFloat **ppPVar13;
  PSymbol *pPVar14;
  FxExpression *pFVar15;
  PPointer *pPVar16;
  PArray *type;
  long lVar17;
  FPropertyInfo *pFVar18;
  FString *pFVar19;
  FxDamageValue *pFVar20;
  FxIntCast *this;
  PClassActor *pPVar21;
  FState *pFVar22;
  uint uVar23;
  PFloat *pPVar24;
  EDefinitionType def;
  char *pcVar25;
  byte *pbVar26;
  SWORD SVar27;
  char cVar28;
  SavedPos SVar29;
  TArray<PType_*,_PType_*> rets;
  FPropParam pref;
  SavedPos pos;
  FScanner newscanner;
  FxDamageValue *local_1a0;
  undefined1 local_198 [8];
  FString FStack_190;
  char local_181;
  PClassActor *local_180;
  undefined8 local_178;
  FString local_170;
  PSymbolTable *local_168;
  char *local_160;
  _func_int **local_158;
  FPropertyInfo *local_150;
  AActor *local_148;
  SavedPos local_140;
  undefined1 local_130 [9];
  bool bStack_127;
  undefined6 uStack_126;
  undefined2 local_120;
  int local_11c;
  int local_118;
  undefined1 local_110 [48];
  char *pcStack_e0;
  DDropItem *local_d8;
  FScriptPosition local_d0 [10];
  
  local_160 = FString::NullString.Nothing;
  local_158 = (_func_int **)&PTR__FxConstant_008682d0;
  do {
    SVar29 = FScanner::SavePos(sc);
    local_140.SavedScriptPtr = SVar29.SavedScriptPtr;
    local_140.SavedScriptLine = SVar29.SavedScriptLine;
    local_181 = FScanner::GetToken(sc);
    if (!(bool)local_181) {
      return;
    }
    iVar8 = sc->TokenType;
    if (iVar8 < 0x127) {
      if (iVar8 == 0x3b) {
        FScanner::ScriptError(sc,"Unexpected \';\'");
      }
      else {
        if (iVar8 == 0x101) {
          bVar7 = FScanner::Compare(sc,"ACTOR");
          if (bVar7) {
            local_130._0_8_ = local_160;
            local_110._40_8_ = (FState *)0x0;
            pcStack_e0 = (char *)0x0;
            local_110._16_8_ = (char *)0x0;
            local_110._24_8_ = (FState *)0x0;
            local_110._0_8_ = (FStateDefine *)0x0;
            local_110._8_4_ = 0;
            local_110._12_4_ = 0;
            local_110._32_8_ = (char *)0xffffffffffffffff;
            local_d0[0].FileName.Chars = local_160;
            FString::NullString.RefCount = FString::NullString.RefCount + 2;
            local_d0[0].ScriptLine = 0;
            FScanner::MustGetString(sc);
            pcVar11 = strchr(sc->String,0x3a);
            if (pcVar11 == (char *)0x0) {
              pcVar25 = (char *)0x0;
            }
            else {
              pcVar25 = pcVar11 + 1;
              *pcVar11 = '\0';
            }
            iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
            if (pcVar25 == (char *)0x0) {
              FScanner::MustGetString(sc);
              pcVar25 = sc->String + 1;
              if (*sc->String != ':') {
                pcVar25 = (char *)0x0;
              }
            }
            if (pcVar25 == (char *)0x0) {
              pcVar25 = (char *)0x0;
            }
            else if (*pcVar25 == '\0') {
              FScanner::MustGetString(sc);
              pcVar25 = sc->String;
            }
            if (pcVar25 == (char *)0x0) {
              FScanner::UnGet(sc);
            }
            iVar9 = FName::NameManager::FindName(&FName::NameData,pcVar25,false);
            bVar7 = FScanner::CheckString(sc,"replaces");
            local_180 = (PClassActor *)((ulong)local_180 & 0xffffffff00000000);
            local_168 = (PSymbolTable *)(long)iVar8;
            if (bVar7) {
              FScanner::MustGetString(sc);
              iVar10 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
              local_180 = (PClassActor *)CONCAT44(local_180._4_4_,iVar10);
              if (iVar10 == iVar8) {
                FScanner::ScriptMessage
                          (sc,"Cannot replace class %s with itself",
                           FName::NameData.NameArray[(long)local_168].Text);
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              }
            }
            FScanner::SetCMode(sc,true);
            bVar7 = FScanner::CheckNumber(sc);
            iVar10 = -1;
            if ((bVar7) && (iVar10 = sc->Number, 0x8000 < iVar10 + 1U)) {
              FScanner::ScriptMessage(sc,"DoomEdNum must be in the range [-1,32767]");
              FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              iVar10 = -1;
            }
            bVar7 = FScanner::CheckString(sc,"native");
            FScriptPosition::FScriptPosition((FScriptPosition *)local_198,sc);
            local_1a0 = (FxDamageValue *)CONCAT44(local_1a0._4_4_,iVar8);
            local_178 = (DWORD *)CONCAT44(local_178._4_4_,iVar9);
            pPVar12 = CreateNewActor((FScriptPosition *)local_198,(FName *)&local_1a0,
                                     (FName *)&local_178,bVar7);
            FString::~FString((FString *)local_198);
            SVar27 = (SWORD)iVar10;
            if (iVar10 < 1) {
              SVar27 = -1;
            }
            pPVar12->DoomEdNum = SVar27;
            FWadCollection::GetLumpFullPath((FWadCollection *)local_198,0xa861c0);
            FString::operator=(&pPVar12->SourceLumpName,(FString *)local_198);
            FString::~FString((FString *)local_198);
            local_198._0_4_ = (uint)local_180;
            SetReplacement(sc,pPVar12,(FName *)local_198);
            if (pPVar12 == (PClassActor *)AActor::RegistrationInfo.MyClass) {
              pPVar21 = (PClassActor *)0x0;
            }
            else {
              pPVar21 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
            }
            local_d8 = (DDropItem *)0x0;
            local_120._0_1_ = false;
            local_120._1_1_ = false;
            local_11c = 0;
            FStateDefinitions::MakeStateDefines((FStateDefinitions *)local_110,pPVar21);
            local_118 = sc->LumpNum;
            unique0x10001f6b = pPVar12;
            FString::operator=((FString *)local_130,FName::NameData.NameArray[(long)local_168].Text)
            ;
            FScanner::MustGetToken(sc,0x7b);
            local_168 = &(pPVar12->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                         super_PType.Symbols;
            local_180 = pPVar12;
LAB_00674efd:
            FScanner::MustGetAnyToken(sc);
            iVar8 = sc->TokenType;
            if (0x126 < iVar8) {
              if (iVar8 < 0x153) {
                if (iVar8 == 0x127) {
                  ParseConstant(sc,local_168,local_180);
                }
                else {
                  if (iVar8 != 0x142) goto LAB_00675450;
                  ParseEnum(sc,local_168,local_180);
                }
                goto LAB_00674efd;
              }
              if (iVar8 == 0x153) {
                FStack_190.Chars = (char *)0x1;
                local_198 = (undefined1  [8])
                            M_Malloc_Dbg(8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                                         ,0x91);
                if ((sc->LumpNum == -1) ||
                   (iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar8)) {
                  FScanner::ScriptMessage(sc,"functions can only be declared by native actors!");
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                }
                FScanner::MustGetAnyToken(sc);
                pPVar6 = TypeState;
                pPVar5 = TypeFloat64;
                pPVar4 = TypeBool;
                pPVar24 = (PFloat *)TypeSInt32;
                iVar8 = sc->TokenType;
                if (iVar8 < 0x13a) {
                  if (iVar8 != 0x101) {
                    if (iVar8 == 0x132) {
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                      pPVar24 = (PFloat *)pPVar4;
                    }
                    else {
                      if (iVar8 != 0x133) {
LAB_006754e4:
                        FScanner::ScriptError(sc,"Invalid return type %s",sc->String);
                        goto LAB_0067555e;
                      }
                      TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                      pPVar24 = pPVar5;
                    }
                    goto LAB_00675511;
                  }
                  pPVar16 = NewPointer((PType *)DObject::RegistrationInfo.MyClass);
                  TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                  (&(((PBasicType *)local_198)->super_PType).super_DObject._vptr_DObject)
                  [FStack_190.Chars._4_4_] = (_func_int **)pPVar16;
                  FStack_190.Chars._4_4_ = FStack_190.Chars._4_4_ + 1;
                  FScanner::ScriptError(sc,"Object type variables not implemented yet!");
                }
                else {
                  if (iVar8 == 0x13a) {
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                  }
                  else {
                    if (iVar8 == 0x13e) goto LAB_00675525;
                    if (iVar8 != 0x146) goto LAB_006754e4;
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                    pPVar24 = (PFloat *)pPVar6;
                  }
LAB_00675511:
                  (&(((PBasicType *)local_198)->super_PType).super_DObject._vptr_DObject)
                  [FStack_190.Chars._4_4_] = (_func_int **)pPVar24;
                  FStack_190.Chars._4_4_ = FStack_190.Chars._4_4_ + 1;
                }
LAB_00675525:
                FScanner::MustGetToken(sc,0x101);
                iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                local_1a0 = (FxDamageValue *)CONCAT44(local_1a0._4_4_,iVar8);
                ParseFunctionDef(sc,local_180,(FName *)&local_1a0,
                                 (TArray<PType_*,_PType_*> *)local_198,2);
                goto LAB_0067555e;
              }
              if (iVar8 == 0x154) {
                if ((local_180->super_PClass).bRuntimeClass == false) {
                  FScanner::ScriptError(sc,"Native classes may not have user variables");
                }
                FScanner::MustGetAnyToken(sc);
                if ((sc->TokenType != 0x133) && (sc->TokenType != 0x13a)) {
                  FScanner::ScriptMessage(sc,"User variables must be of type \'int\' or \'float\'");
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                }
                ppPVar13 = &TypeFloat64;
                if (sc->TokenType == 0x13a) {
                  ppPVar13 = (PFloat **)&TypeSInt32;
                }
                type = (PArray *)*ppPVar13;
                FScanner::MustGetToken(sc,0x101);
                if ((sc->StringLen < 6) || (iVar8 = strncasecmp("user_",sc->String,5), iVar8 != 0))
                {
                  FScanner::ScriptMessage(sc,"User variable names must begin with \"user_\"");
                  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                }
                iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                local_1a0 = (FxDamageValue *)CONCAT44(local_1a0._4_4_,iVar8);
                pPVar14 = PSymbolTable::FindSymbol(local_168,(FName *)&local_1a0,true);
                if (pPVar14 == (PSymbol *)0x0) {
                  bVar7 = FScanner::CheckToken(sc,0x5b);
                  if (bVar7) {
                    pFVar15 = ParseExpression(sc,local_180,true);
                    if (pFVar15 == (FxExpression *)0x0) {
                      FScanner::ScriptMessage(sc,"Error while resolving array size");
LAB_0067558f:
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                      uVar23 = 1;
                    }
                    else {
                      iVar9 = (*pFVar15->_vptr_FxExpression[3])(pFVar15);
                      if ((char)iVar9 == '\0') {
                        FScanner::ScriptMessage(sc,"Array size must be a constant");
                        goto LAB_0067558f;
                      }
                      local_198 = (undefined1  [8])pFVar15[1]._vptr_FxExpression;
                      if (local_198 == (undefined1  [8])TypeString) {
                        FString::AttachToOther(&FStack_190,(FString *)&pFVar15[1].JumpAddresses);
                      }
                      else {
                        FStack_190.Chars = (char *)pFVar15[1].JumpAddresses.Array;
                      }
                      iVar9 = (*(((PBasicType *)local_198)->super_PType).super_DObject._vptr_DObject
                                [0x12])();
                      if (iVar9 == 1) {
                        uVar23 = (uint)(double)FStack_190.Chars;
                      }
                      else {
                        uVar23 = 0;
                        if (iVar9 == 0) {
                          uVar23 = (uint)FStack_190.Chars;
                        }
                      }
                      if (local_198 == (undefined1  [8])TypeString) {
                        FString::~FString(&FStack_190);
                      }
                    }
                    FScanner::MustGetToken(sc,0x5d);
                    if ((int)uVar23 < 1) {
                      FScanner::ScriptMessage(sc,"Array size must be positive");
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                      uVar23 = 1;
                    }
                    type = NewArray((PType *)type,uVar23);
                  }
                  FScanner::MustGetToken(sc,0x3b);
                  local_198._0_4_ = iVar8;
                  lVar17 = (**(code **)((long)(local_180->super_PClass).super_PStruct.
                                              super_PNamedType.super_PCompoundType.super_PType.
                                              super_DObject._vptr_DObject + 0xa8))
                                     (local_180,(FWadCollection *)local_198,type);
                  if (lVar17 != 0) goto LAB_00674efd;
                  pcVar11 = FName::NameData.NameArray[iVar8].Text;
                  pcVar25 = "\'%s\' is already defined in \'%s\'.";
                }
                else {
                  pcVar11 = FName::NameData.NameArray[iVar8].Text;
                  pcVar25 = "\'%s\' is already defined in \'%s\' or one of its ancestors.";
                }
                FScanner::ScriptMessage(sc,pcVar25,pcVar11);
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                goto LAB_00674efd;
              }
              if (iVar8 != 0x17a) goto LAB_00675450;
              if (local_120._1_1_ == true) {
                FScanner::ScriptMessage
                          (sc,"\'%s\' contains multiple state declarations",
                           FName::NameData.NameArray
                           [(stack0xfffffffffffffed8->super_PClass).super_PStruct.super_PNamedType.
                            TypeName.Index].Text);
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              }
              ParseStates(sc,stack0xfffffffffffffed8,
                          (AActor *)(stack0xfffffffffffffed8->super_PClass).Defaults,
                          (Baggage *)local_130);
              local_120._1_1_ = true;
              goto LAB_00674efd;
            }
            if (iVar8 < 0x7d) {
              if ((iVar8 == 0x2b) || (iVar8 == 0x2d)) {
                FScanner::MustGetString(sc);
                FString::FString((FString *)local_198,sc->String);
                bVar7 = FScanner::CheckString(sc,".");
                if (bVar7) {
                  FScanner::MustGetString(sc);
                  pcVar11 = sc->String;
                }
                else {
                  pcVar11 = (char *)0x0;
                }
                HandleActorFlag(sc,(Baggage *)local_130,(char *)local_198,pcVar11,iVar8);
                FString::~FString((FString *)local_198);
              }
              else {
LAB_00675450:
                FScanner::ScriptError(sc,"Unexpected \'%s\' in definition of \'%s\'",sc->String);
              }
              goto LAB_00674efd;
            }
            if (iVar8 == 0x101) {
              cVar28 = *sc->String;
              pcVar11 = sc->String;
              while (cVar28 != '\0') {
                iVar8 = tolower((int)cVar28);
                *pcVar11 = (char)iVar8;
                cVar28 = pcVar11[1];
                pcVar11 = pcVar11 + 1;
              }
              FString::FString(&local_170,sc->String);
              bVar7 = FScanner::CheckString(sc,".");
              if (bVar7) {
                FScanner::MustGetString(sc);
                FString::operator+=(&local_170,'.');
                cVar28 = *sc->String;
                pcVar11 = sc->String;
                while (cVar28 != '\0') {
                  iVar8 = tolower((int)cVar28);
                  *pcVar11 = (char)iVar8;
                  cVar28 = pcVar11[1];
                  pcVar11 = pcVar11 + 1;
                }
                FString::operator+=(&local_170,sc->String);
              }
              else {
                FScanner::UnGet(sc);
              }
              pFVar18 = FindProperty(local_170.Chars);
              if (pFVar18 == (FPropertyInfo *)0x0) {
                iVar8 = MatchString(local_170.Chars,
                                    (char **)ParseActorProperty(FScanner&,Baggage&)::statenames);
                pPVar12 = stack0xfffffffffffffed8;
                statename.Chars = local_170.Chars;
                if (iVar8 == -1) {
                  FScanner::ScriptError(sc,"\"%s\" is an unknown actor property\n",local_170.Chars);
                }
                else {
                  bVar7 = FScanner::GetString(sc);
                  if (((!bVar7) || (sc->Crossed != false)) ||
                     (bVar7 = FScanner::Compare(sc,"0"), bVar7)) {
LAB_00675ef8:
                    pFVar22 = (FState *)0x0;
                  }
                  else {
                    bVar7 = FScanner::Compare(sc,"PARENT");
                    if (!bVar7) {
                      FScanner::ScriptMessage(sc,"Invalid state assignment");
LAB_00675ea4:
                      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                      goto LAB_00675ef8;
                    }
                    FScanner::MustGetString(sc);
                    pPVar21 = dyn_cast<PClassActor>((DObject *)(pPVar12->super_PClass).ParentClass);
                    if (pPVar21 == (PClassActor *)0x0) {
                      pFVar22 = (FState *)0x0;
                    }
                    else {
                      iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                      local_198._0_4_ = iVar8;
                      pFVar22 = PClassActor::FindState(pPVar21,1,(FName *)local_198,false);
                    }
                    bVar7 = FScanner::GetString(sc);
                    iVar8 = 0;
                    if (bVar7) {
                      bVar7 = FScanner::Compare(sc,"+");
                      if (bVar7) {
                        FScanner::MustGetNumber(sc);
                        iVar8 = sc->Number;
                      }
                      else {
                        FScanner::UnGet(sc);
                        iVar8 = 0;
                      }
                    }
                    if (pFVar22 == (FState *)0x0 && iVar8 == 0) goto LAB_00675ef8;
                    if (iVar8 != 0 && pFVar22 == (FState *)0x0) {
                      FScanner::ScriptMessage
                                (sc,"Attempt to get invalid state from actor %s\n",
                                 FName::NameData.NameArray
                                 [(((pPVar12->super_PClass).ParentClass)->super_PStruct).
                                  super_PNamedType.TypeName.Index].Text);
                      goto LAB_00675ea4;
                    }
                    pFVar22 = pFVar22 + iVar8;
                  }
                  FStateDefinitions::SetStateLabel
                            ((FStateDefinitions *)local_110,statename.Chars,pFVar22,'\x01');
                }
              }
              else {
                pPVar12 = stack0xfffffffffffffed8;
                if (stack0xfffffffffffffed8 != (PClassActor *)*pFVar18->cls) {
                  do {
                    pPVar12 = (PClassActor *)(pPVar12->super_PClass).ParentClass;
                    if (pPVar12 == (PClassActor *)*pFVar18->cls) break;
                  } while (pPVar12 != (PClassActor *)0x0);
                  if (pPVar12 == (PClassActor *)0x0) {
                    FScanner::ScriptMessage
                              (sc,"\"%s\" requires an actor of type \"%s\"\n",local_170.Chars);
                    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
                    goto LAB_00675f0f;
                  }
                }
                local_148 = (AActor *)(stack0xfffffffffffffed8->super_PClass).Defaults;
                if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params == '\0')
                {
                  ParseDecorate();
                }
                if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings == '\0')
                {
                  ParseDecorate();
                }
                if (DAT_00a91d4c != 0) {
                  DAT_00a91d4c = 0;
                }
                if (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._12_4_
                    != 0) {
                  TArray<FString,_FString>::DoDelete
                            ((TArray<FString,_FString> *)
                             ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings
                             ,0,ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                strings._12_4_ - 1);
                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings._12_4_ = 0
                  ;
                }
                TArray<FPropParam,_FPropParam>::Grow
                          ((TArray<FPropParam,_FPropParam> *)
                           &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,1
                          );
                DAT_00a91d4c = DAT_00a91d4c + 1;
                *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params = 0;
                pbVar26 = (byte *)pFVar18->params;
                local_150 = pFVar18;
                if (*pbVar26 != 0x30) {
LAB_00675810:
                  if (*pbVar26 == 0) goto LAB_00675d63;
                  local_1a0 = (FxDamageValue *)0x0;
                  local_178 = (DWORD *)0xffffffff;
                  FScriptPosition::FScriptPosition((FScriptPosition *)local_198,sc);
                  FScriptPosition::operator=(local_d0,(FScriptPosition *)local_198);
                  FString::~FString((FString *)local_198);
                  switch(*pbVar26 & 0xdf) {
                  case 0x43:
                    bVar7 = FScanner::CheckNumber(sc);
                    if (!bVar7) {
                      FScanner::MustGetString(sc);
                      pcVar11 = sc->String;
                      uVar23 = TArray<FString,_FString>::Reserve
                                         ((TArray<FString,_FString> *)
                                          ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                          ::strings,1);
                      pFVar19 = FString::operator=((FString *)
                                                   ((ulong)uVar23 * 8 +
                                                                                                      
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),pcVar11);
                      local_1a0 = (FxDamageValue *)pFVar19->Chars;
                      local_178 = (DWORD *)CONCAT44(local_178._4_4_,1);
                      break;
                    }
                    iVar8 = sc->Number;
                    if (0xfe < iVar8) {
                      iVar8 = 0xff;
                    }
                    if (iVar8 < 1) {
                      iVar8 = 0;
                    }
                    FScanner::CheckString(sc,",");
                    FScanner::MustGetNumber(sc);
                    iVar9 = sc->Number;
                    if (0xfe < iVar9) {
                      iVar9 = 0xff;
                    }
                    if (iVar9 < 1) {
                      iVar9 = 0;
                    }
                    FScanner::CheckString(sc,",");
                    FScanner::MustGetNumber(sc);
                    uVar23 = sc->Number;
                    if (0xfe < (int)uVar23) {
                      uVar23 = 0xff;
                    }
                    bVar7 = false;
                    if ((int)uVar23 < 1) {
                      uVar23 = 0;
                    }
                    local_1a0 = (FxDamageValue *)
                                CONCAT44(local_1a0._4_4_,iVar9 << 8 | iVar8 << 0x10 | uVar23);
                    local_178 = (DWORD *)((ulong)local_178 & 0xffffffff00000000);
                    goto LAB_00675c50;
                  default:
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                                  ,0x3c8,
                                  "bool ParsePropertyParams(FScanner &, FPropertyInfo *, AActor *, Baggage &)"
                                 );
                  case 0x46:
                    FScanner::MustGetFloat(sc);
                    local_1a0 = (FxDamageValue *)sc->Float;
                    break;
                  case 0x49:
                    FScanner::MustGetNumber(sc);
LAB_00675a96:
                    iVar8 = sc->Number;
                    goto LAB_00675a9a;
                  case 0x4c:
                    bVar7 = FScanner::CheckNumber(sc);
                    if (bVar7) {
                      local_178 = (DWORD *)((ulong)local_178._4_4_ << 0x20);
                      goto LAB_00675a96;
                    }
                    local_178 = (DWORD *)CONCAT44(local_178._4_4_,1);
                    TArray<FPropParam,_FPropParam>::Grow
                              ((TArray<FPropParam,_FPropParam> *)
                               &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                params,1);
                    *(DWORD **)
                     (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                     (ulong)DAT_00a91d4c * 2) = local_178;
                    DAT_00a91d4c = DAT_00a91d4c + 1;
                    *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                         *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1
                    ;
                    do {
                      FScanner::MustGetString(sc);
                      pcVar11 = sc->String;
                      uVar23 = TArray<FString,_FString>::Reserve
                                         ((TArray<FString,_FString> *)
                                          ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                          ::strings,1);
                      pFVar19 = FString::operator=((FString *)
                                                   ((ulong)uVar23 * 8 +
                                                                                                      
                                                  ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                  ::strings._0_8_),pcVar11);
                      pFVar20 = (FxDamageValue *)pFVar19->Chars;
                      TArray<FPropParam,_FPropParam>::Grow
                                ((TArray<FPropParam,_FPropParam> *)
                                 &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                  params,1);
                      *(FxDamageValue **)
                       (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                       (ulong)DAT_00a91d4c * 2) = pFVar20;
                      DAT_00a91d4c = DAT_00a91d4c + 1;
                      *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
                           *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                           1;
                      bVar7 = FScanner::CheckString(sc,",");
                    } while (bVar7);
                    bVar7 = false;
                    local_1a0 = pFVar20;
                    goto LAB_00675cc3;
                  case 0x4d:
                    iVar8 = ParseFlagExpressionString
                                      (sc,(FParseValue *)ParseMorphStyle(FScanner&)::morphstyles);
                    goto LAB_00675a9a;
                  case 0x4e:
                    iVar8 = ParseFlagExpressionString
                                      (sc,(FParseValue *)
                                          ParseThingActivation(FScanner&)::activationstyles);
LAB_00675a9a:
                    local_1a0 = (FxDamageValue *)CONCAT44(local_1a0._4_4_,iVar8);
                    break;
                  case 0x53:
                    goto switchD_00675874_caseD_53;
                  case 0x54:
                    FScanner::MustGetString(sc);
                    strbin1((char *)local_198);
                    uVar23 = TArray<FString,_FString>::Reserve
                                       ((TArray<FString,_FString> *)
                                        ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                        ::strings,1);
                    pFVar19 = FString::operator=((FString *)
                                                 ((ulong)uVar23 * 8 +
                                                 ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)
                                                 ::strings._0_8_),(FString *)local_198);
                    local_1a0 = (FxDamageValue *)pFVar19->Chars;
                    FString::~FString((FString *)local_198);
                    break;
                  case 0x58:
                    bVar7 = FScanner::CheckString(sc,"(");
                    if (bVar7) {
                      pFVar20 = (FxDamageValue *)operator_new(0x50);
                      this = (FxIntCast *)operator_new(0x40);
                      pFVar15 = ParseExpression(sc,stack0xfffffffffffffed8,false);
                      FxIntCast::FxIntCast(this,pFVar15);
                      FxDamageValue::FxDamageValue(pFVar20,(FxExpression *)this,true);
                      FScanner::MustGetStringName(sc,")");
                    }
                    else {
                      FScanner::MustGetNumber(sc);
                      iVar8 = sc->Number;
                      if (iVar8 == 0) {
                        pFVar20 = (FxDamageValue *)0x0;
                      }
                      else {
                        pFVar20 = (FxDamageValue *)operator_new(0x50);
                        pFVar15 = (FxExpression *)operator_new(0x48);
                        FxExpression::FxExpression(pFVar15,local_d0);
                        pFVar15->_vptr_FxExpression = local_158;
                        pPVar3 = TypeSInt32;
                        pFVar15[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
                        pFVar15->ValueType = (PType *)pPVar3;
                        *(int *)&pFVar15[1].JumpAddresses.Array = iVar8;
                        pFVar15->isresolved = true;
                        FxDamageValue::FxDamageValue(pFVar20,pFVar15,false);
                      }
                    }
                    local_1a0 = pFVar20;
                    TArray<FPropParam,_FPropParam>::Grow
                              ((TArray<FPropParam,_FPropParam> *)
                               &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                                params,1);
                    *(FxDamageValue **)
                     (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
                     (ulong)DAT_00a91d4c * 2) = pFVar20;
                    DAT_00a91d4c = DAT_00a91d4c + 1;
                    break;
                  case 0x5a:
                    bVar7 = FScanner::CheckFloat(sc);
                    if (bVar7) {
                      bVar7 = true;
                      FScanner::UnGet(sc);
                      goto LAB_00675c50;
                    }
                    goto switchD_00675874_caseD_53;
                  }
                  goto LAB_00675c4e;
                }
LAB_00675d63:
                (*local_150->Handler)
                          (local_148,stack0xfffffffffffffed8,(Baggage *)local_130,
                           (FPropParam *)
                           ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params);
              }
LAB_00675f0f:
              FString::~FString(&local_170);
              goto LAB_00674efd;
            }
            if (iVar8 == 0x124) {
              local_198 = (undefined1  [8])0x0;
              FStack_190.Chars = (char *)0x0;
              if ((sc->LumpNum == -1) ||
                 (iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum), 0 < iVar8)) {
                FScanner::ScriptMessage
                          (sc,
                           "Action functions can only be imported by internal class and actor definitions!"
                          );
                FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
              }
              FScanner::MustGetToken(sc,0x153);
              do {
                bVar7 = FScanner::CheckToken(sc,0x132);
                pPVar24 = (PFloat *)TypeBool;
                if (bVar7) {
                  TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
LAB_006750c7:
                  (&(((PBasicType *)local_198)->super_PType).super_DObject._vptr_DObject)
                  [FStack_190.Chars._4_4_] = (_func_int **)pPVar24;
                  FStack_190.Chars._4_4_ = FStack_190.Chars._4_4_ + 1;
                }
                else {
                  bVar7 = FScanner::CheckToken(sc,0x13a);
                  pPVar24 = (PFloat *)TypeSInt32;
                  if (bVar7) {
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                    goto LAB_006750c7;
                  }
                  bVar7 = FScanner::CheckToken(sc,0x146);
                  pPVar24 = (PFloat *)TypeState;
                  if (bVar7) {
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                    goto LAB_006750c7;
                  }
                  bVar7 = FScanner::CheckToken(sc,0x133);
                  pPVar24 = TypeFloat64;
                  if (bVar7) {
                    TArray<PType_*,_PType_*>::Grow((TArray<PType_*,_PType_*> *)local_198,1);
                    goto LAB_006750c7;
                  }
                }
                bVar7 = FScanner::CheckToken(sc,0x2c);
              } while (bVar7);
              FScanner::MustGetToken(sc,0x101);
              iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
              local_1a0 = (FxDamageValue *)CONCAT44(local_1a0._4_4_,iVar8);
              ParseFunctionDef(sc,local_180,(FName *)&local_1a0,
                               (TArray<PType_*,_PType_*> *)local_198,6);
LAB_0067555e:
              TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)local_198);
              goto LAB_00674efd;
            }
            if (iVar8 != 0x7d) goto LAB_00675450;
            FScriptPosition::FScriptPosition((FScriptPosition *)local_198,sc);
            FinishActor((FScriptPosition *)local_198,local_180,(Baggage *)local_130);
            FString::~FString((FString *)local_198);
            FScanner::SetCMode(sc,false);
            FString::~FString(&local_d0[0].FileName);
            TArray<FState,_FState>::~TArray((TArray<FState,_FState> *)(local_110 + 0x28));
            TArray<FStateDefine,_FStateDefine>::~TArray
                      ((TArray<FStateDefine,_FStateDefine> *)local_110);
            FString::~FString((FString *)local_130);
            goto LAB_00676158;
          }
          bVar7 = FScanner::Compare(sc,"PICKUP");
          if (bVar7) {
            def = DEF_Pickup;
          }
          else {
            bVar7 = FScanner::Compare(sc,"BREAKABLE");
            if (bVar7) {
              def = DEF_BreakableDecoration;
            }
            else {
              bVar7 = FScanner::Compare(sc,"PROJECTILE");
              if (!bVar7) {
                bVar7 = FScanner::Compare(sc,"DAMAGETYPE");
                if (!bVar7) goto LAB_00676141;
                FScanner::SetCMode(sc,true);
                FScanner::MustGetString(sc);
                iVar8 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
                local_130._0_8_ = (char *)0x3ff0000000000000;
                stack0xfffffffffffffed8 =
                     (PClassActor *)((ulong)stack0xfffffffffffffed8 & 0xffffffffffff0000);
                FScanner::MustGetToken(sc,0x7b);
                while (FScanner::MustGetAnyToken(sc), sc->TokenType != 0x7d) {
                  bVar7 = FScanner::Compare(sc,"FACTOR");
                  if (bVar7) {
                    FScanner::MustGetFloat(sc);
                    local_130._0_8_ = sc->Float;
                    if (((double)local_130._0_8_ == 0.0) && (!NAN((double)local_130._0_8_))) {
LAB_00676101:
                      stack0xfffffffffffffed8 = (PClassActor *)CONCAT71(_bStack_127,1);
                    }
                  }
                  else {
                    bVar7 = FScanner::Compare(sc,"REPLACEFACTOR");
                    if (bVar7) goto LAB_00676101;
                    bVar7 = FScanner::Compare(sc,"NOARMOR");
                    if (bVar7) {
                      stack0xfffffffffffffed8 = CONCAT11(true,local_130[8]);
                    }
                    else {
                      FScanner::ScriptError
                                (sc,"Unexpected data (%s) in damagetype definition.",sc->String);
                    }
                  }
                }
                local_198._0_4_ = iVar8;
                DamageTypeDefinition::Apply((DamageTypeDefinition *)local_130,(FName *)local_198);
                FScanner::SetCMode(sc,false);
                goto LAB_00676158;
              }
              def = DEF_Projectile;
            }
          }
        }
        else {
LAB_00676141:
          FScanner::RestorePos(sc,&local_140);
          def = DEF_Decoration;
        }
        ParseOldDecoration(sc,def);
      }
    }
    else if (iVar8 == 0x127) {
      ParseConstant(sc,&GlobalSymbols,(PClassActor *)0x0);
    }
    else if (iVar8 == 0x142) {
      ParseEnum(sc,&GlobalSymbols,(PClassActor *)0x0);
    }
    else {
      if (iVar8 != 0x171) goto LAB_00676141;
      FScanner::MustGetString(sc);
      iVar8 = FWadCollection::GetLumpFile(&Wads,sc->LumpNum);
      if ((iVar8 == 0) &&
         (iVar8 = DArgs::CheckParm(Args,"-allowdecoratecrossincludes",1), iVar8 == 0)) {
        iVar8 = FWadCollection::CheckNumForFullName(&Wads,sc->String,true,0);
        iVar8 = FWadCollection::GetLumpFile(&Wads,iVar8);
        if (iVar8 != 0) {
          pcVar11 = FWadCollection::GetWadFullName(&Wads,iVar8);
          I_FatalError("File %s is overriding core lump %s.",pcVar11,sc->String);
        }
      }
      FScanner::FScanner((FScanner *)local_130);
      FScanner::Open((FScanner *)local_130,sc->String);
      ParseDecorate((FScanner *)local_130);
      FScanner::~FScanner((FScanner *)local_130);
    }
LAB_00676158:
    if (local_181 == '\0') {
      return;
    }
  } while( true );
switchD_00675874_caseD_53:
  FScanner::MustGetString(sc);
  pcVar11 = sc->String;
  uVar23 = TArray<FString,_FString>::Reserve
                     ((TArray<FString,_FString> *)
                      ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::strings,1);
  pFVar19 = FString::operator=((FString *)
                               ((ulong)uVar23 * 8 +
                               ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::
                               strings._0_8_),pcVar11);
  local_1a0 = (FxDamageValue *)pFVar19->Chars;
LAB_00675c4e:
  bVar7 = false;
LAB_00675c50:
  if (local_178._0_4_ != -1) {
    TArray<FPropParam,_FPropParam>::Grow
              ((TArray<FPropParam,_FPropParam> *)
               &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,1);
    *(DWORD **)
     (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params +
     (ulong)DAT_00a91d4c * 2) = local_178;
    DAT_00a91d4c = DAT_00a91d4c + 1;
    *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
         *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1;
  }
  TArray<FPropParam,_FPropParam>::Grow
            ((TArray<FPropParam,_FPropParam> *)
             &ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params,1);
  *(FxDamageValue **)
   (ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + (ulong)DAT_00a91d4c * 2
   ) = local_1a0;
  DAT_00a91d4c = DAT_00a91d4c + 1;
  *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params =
       *ParsePropertyParams(FScanner&,FPropertyInfo*,AActor*,Baggage&)::params + 1;
LAB_00675cc3:
  pbVar1 = pbVar26 + 1;
  bVar2 = pbVar26[1];
  pbVar26 = pbVar26 + 2;
  if (bVar2 != 0x5f) {
    pbVar26 = pbVar1;
  }
  cVar28 = '\x02';
  if (!bVar7) {
    cVar28 = '\x03';
    if (*pbVar26 != 0) {
      if ((char)*pbVar26 < 'a') {
        if (bVar2 == 0x5f) {
          FScanner::CheckString(sc,",");
        }
        else {
          FScanner::MustGetStringName(sc,",");
        }
LAB_00675d56:
        cVar28 = '\0';
      }
      else {
        bVar7 = FScanner::CheckString(sc,",");
        if (bVar2 == 0x5f && !bVar7) {
          bVar7 = FScanner::CheckFloat(sc);
          if (bVar7) {
            FScanner::UnGet(sc);
            goto LAB_00675d56;
          }
        }
        else {
          cVar28 = !bVar7 * '\x03';
        }
      }
    }
  }
  if (cVar28 == '\x03') goto LAB_00675d63;
  goto LAB_00675810;
}

Assistant:

void ParseDecorate (FScanner &sc)
{
	// Get actor class name.
	for(;;)
	{
		FScanner::SavedPos pos = sc.SavePos();
		if (!sc.GetToken ())
		{
			return;
		}
		switch (sc.TokenType)
		{
		case TK_Include:
		{
			sc.MustGetString();
			// This check needs to remain overridable for testing purposes.
			if (Wads.GetLumpFile(sc.LumpNum) == 0 && !Args->CheckParm("-allowdecoratecrossincludes"))
			{
				int includefile = Wads.GetLumpFile(Wads.CheckNumForFullName(sc.String, true));
				if (includefile != 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(includefile), sc.String);
				}
			}
			FScanner newscanner;
			newscanner.Open(sc.String);
			ParseDecorate(newscanner);
			break;
		}

		case TK_Const:
			ParseConstant (sc, &GlobalSymbols, NULL);
			break;

		case TK_Enum:
			ParseEnum (sc, &GlobalSymbols, NULL);
			break;

		case ';':
			// ';' is the start of a comment in the non-cmode parser which
			// is used to parse parts of the DECORATE lump. If we don't add 
			// a check here the user will only get weird non-informative
			// error messages if a semicolon is found.
			sc.ScriptError("Unexpected ';'");
			break;

		case TK_Identifier:
			// 'ACTOR' cannot be a keyword because it is also needed as a class identifier
			// so let's do a special case for this.
			if (sc.Compare("ACTOR"))
			{
				ParseActor (sc);
				break;
			}
			else if (sc.Compare("PICKUP"))
			{
				ParseOldDecoration (sc, DEF_Pickup);
				break;
			}
			else if (sc.Compare("BREAKABLE"))
			{
				ParseOldDecoration (sc, DEF_BreakableDecoration);
				break;
			}
			else if (sc.Compare("PROJECTILE"))
			{
				ParseOldDecoration (sc, DEF_Projectile);
				break;
			}
			else if (sc.Compare("DAMAGETYPE"))
			{
				ParseDamageDefinition(sc);
				break;
			}
		default:
			sc.RestorePos(pos);
			ParseOldDecoration(sc, DEF_Decoration);
			break;
		}
	}
}